

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator.c
# Opt level: O1

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = *(double *)((long)user_data + 8);
  pdVar4 = *(double **)((long)y->content + 0x10);
  dVar5 = *pdVar4;
  dVar6 = pdVar4[1];
  dVar2 = pdVar4[2];
  pdVar4 = *(double **)((long)ydot->content + 0x10);
  dVar3 = *(double *)((long)user_data + 0x10);
  *pdVar4 = dVar5 * dVar6 * dVar5 + (*user_data - (dVar2 + 1.0) * dVar5);
  pdVar4[1] = dVar5 * dVar2 + -(dVar6 * dVar5) * dVar5;
  pdVar4[2] = (dVar1 - dVar2) / dVar3 - dVar2 * dVar5;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype a  = rdata[0];                    /* access data entries */
  sunrealtype b  = rdata[1];
  sunrealtype ep = rdata[2];
  sunrealtype u  = NV_Ith_S(y, 0); /* access solution values */
  sunrealtype v  = NV_Ith_S(y, 1);
  sunrealtype w  = NV_Ith_S(y, 2);

  /* fill in the RHS function */
  NV_Ith_S(ydot, 0) = a - (w + 1.0) * u + v * u * u;
  NV_Ith_S(ydot, 1) = w * u - v * u * u;
  NV_Ith_S(ydot, 2) = (b - w) / ep - w * u;

  return 0; /* Return with success */
}